

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void issue40(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  runtime_error *this;
  _Alloc_hider _Var12;
  long lVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  byte *pbVar20;
  byte *pbVar21;
  byte *pbVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  double x;
  string a;
  
  std::__cxx11::string::string((string *)&a,"0.",(allocator *)&x);
  bVar8 = *a._M_dataplus._M_p;
  _Var12 = a._M_dataplus;
  if (bVar8 == 0x2d) {
    bVar8 = a._M_dataplus._M_p[1];
    if (9 < (byte)(bVar8 - 0x30)) goto LAB_0010371d;
    _Var12._M_p = a._M_dataplus._M_p + 1;
  }
  if (bVar8 == 0x30) {
    bVar18 = ((byte *)_Var12._M_p)[1];
    if ((byte)(bVar18 - 0x30) < 10) goto LAB_0010371d;
    pbVar21 = (byte *)_Var12._M_p + 1;
    uVar17 = 0;
  }
  else {
    if (9 < (byte)(bVar8 - 0x30)) goto LAB_0010371d;
    uVar17 = (ulong)(byte)(bVar8 - 0x30);
    pbVar21 = (byte *)_Var12._M_p;
    while( true ) {
      pbVar21 = pbVar21 + 1;
      bVar18 = *pbVar21;
      if (9 < (byte)(bVar18 - 0x30)) break;
      uVar17 = (ulong)(byte)(bVar18 - 0x30) + uVar17 * 10;
    }
  }
  if (bVar18 == 0x2e) {
    bVar14 = pbVar21[1] - 0x30;
    if (9 < bVar14) goto LAB_0010371d;
    pbVar20 = pbVar21 + 1;
    lVar24 = 0;
    pbVar21 = pbVar20;
    do {
      uVar17 = (ulong)bVar14 + uVar17 * 10;
      bVar18 = pbVar21[1];
      pbVar21 = pbVar21 + 1;
      bVar14 = bVar18 - 0x30;
      lVar24 = lVar24 + -1;
    } while (bVar14 < 10);
    iVar19 = (int)pbVar20 - (int)lVar24;
  }
  else {
    lVar24 = 0;
    iVar19 = (int)pbVar21;
  }
  if ((bVar18 | 0x20) == 0x65) {
    bVar25 = (pbVar21[1] - 0x2b & 0xfd) == 0;
    pbVar20 = pbVar21 + 1;
    if (bVar25) {
      pbVar20 = pbVar21 + 2;
    }
    bVar18 = pbVar21[(ulong)bVar25 + 1] - 0x30;
    if (9 < bVar18) goto LAB_0010371d;
    bVar14 = pbVar20[1] - 0x30;
    uVar23 = (ulong)bVar18 * 10 + (ulong)bVar14;
    if (9 < bVar14) {
      uVar23 = (ulong)bVar18;
    }
    pbVar22 = pbVar20 + 2;
    if (9 < bVar14) {
      pbVar22 = pbVar20 + 1;
    }
    bVar18 = pbVar20[(ulong)(bVar14 < 10) + 1] - 0x30;
    pbVar22 = pbVar22 + (bVar18 < 10);
    uVar11 = (ulong)bVar18 + uVar23 * 10;
    if (9 < bVar18) {
      uVar11 = uVar23;
    }
    for (; (byte)(*pbVar22 - 0x30) < 10; pbVar22 = pbVar22 + 1) {
      if ((long)uVar11 < 0x100000000) {
        uVar11 = (ulong)(byte)(*pbVar22 - 0x30) + uVar11 * 10;
      }
    }
    uVar23 = -uVar11;
    if (pbVar21[1] != 0x2d) {
      uVar23 = uVar11;
    }
    lVar24 = lVar24 + uVar23;
  }
  if ((int)(~(uint)_Var12._M_p + iVar19) < 0x13) {
LAB_001036fd:
    if (0xfffffffffffffd85 < lVar24 - 0x135U) {
      if ((uVar17 >> 0x35 == 0 && lVar24 + 0x16U < 0x2d) || (uVar17 == 0)) goto LAB_001037ff;
      uVar23 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar17 = uVar17 << ((byte)(uVar23 ^ 0x3f) & 0x3f);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar17;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)
                                ::mantissa_64 + lVar24 * 8 + 0xa28);
      auVar1 = auVar1 * auVar3;
      uVar10 = auVar1._0_8_;
      uVar11 = auVar1._8_8_ & 0x1ff;
      if ((uVar11 == 0x1ff) && (uVar11 = 0x1ff, CARRY8(uVar10,uVar17))) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar17;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)(fast_double_parser::
                                  compute_float_64(long,unsigned_long,bool,bool*)::mantissa_128 +
                                 lVar24 * 8 + 0xa28);
        uVar16 = SUB168(auVar2 * auVar4,8);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar16;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar16;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar16;
        auVar6 = auVar1 + auVar6;
        auVar5 = auVar1 + auVar5;
        uVar15 = auVar1._8_4_ + (uint)CARRY8(uVar10,uVar16) & 0x1ff;
        uVar11 = (ulong)uVar15;
        auVar1 = auVar1 + auVar7;
        if ((CARRY8(SUB168(auVar2 * auVar4,0),uVar17)) &&
           ((auVar1 = auVar5, uVar10 + uVar16 == -1 && (auVar1 = auVar6, uVar15 == 0x1ff))))
        goto LAB_0010370c;
      }
      uVar17 = auVar1._8_8_ >> (9U - (auVar1[0xf] >> 7) & 0x3f);
      uVar15 = (uint)uVar17;
      if (((auVar1._0_8_ != 0) || ((uVar11 != 0 || ((uVar15 & 3) != 1)))) &&
         ((lVar13 = (lVar24 * 0x3526a >> 0x10) + 0x43f,
          lVar24 = (auVar1._8_8_ >> 0x3f ^ 1) + (uVar23 ^ 0x3f) + -1 +
                   (ulong)((uVar15 & 1) + uVar17 >> 0x36 == 0), lVar13 != lVar24 &&
          ((ulong)(lVar13 - lVar24) < 0x7ff)))) goto LAB_001037ff;
    }
  }
  else {
    lVar13 = 1;
    while ((bVar8 == 0x30 || (bVar8 == 0x2e))) {
      pbVar21 = (byte *)_Var12._M_p + lVar13;
      lVar13 = lVar13 + 1;
      bVar8 = *pbVar21;
    }
    if ((int)((iVar19 - (uint)_Var12._M_p) - (int)lVar13) < 0x13) goto LAB_001036fd;
  }
LAB_0010370c:
  pcVar9 = fast_double_parser::parse_float_strtod(a._M_dataplus._M_p,&x);
  if (pcVar9 == (char *)0x0) {
LAB_0010371d:
    std::__cxx11::string::~string((string *)&a);
    return;
  }
LAB_001037ff:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"We should not parse \'0.\'");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void issue40() {
  //https://tools.ietf.org/html/rfc7159
  // A fraction part is a decimal point followed by one or more digits.
  std::string a = "0.";
  double x;
  bool ok = fast_double_parser::parse_number(a.c_str(), &x);
  if(ok) throw std::runtime_error("We should not parse '0.'");
}